

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O1

send_result_t
zmq::send_multipart<std::vector<zmq::message_t,std::allocator<zmq::message_t>>&,void>
          (socket_ref s,vector<zmq::message_t,_std::allocator<zmq::message_t>_> *msgs,
          send_flags flags)

{
  pointer pmVar1;
  _Storage<unsigned_long,_true> _Var2;
  _Storage<unsigned_long,_true> _Var3;
  size_t in_RCX;
  undefined4 in_register_00000014;
  ulong uVar4;
  ulong extraout_RDX;
  undefined8 uVar5;
  int in_R8D;
  pointer pmVar6;
  send_result_t sVar7;
  socket_base local_38;
  
  uVar4 = CONCAT44(in_register_00000014,flags);
  pmVar6 = (msgs->super__Vector_base<zmq::message_t,_std::allocator<zmq::message_t>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pmVar1 = (msgs->super__Vector_base<zmq::message_t,_std::allocator<zmq::message_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  _Var3._M_value = 0;
  local_38 = s.super_socket_base._handle;
  do {
    _Var2 = _Var3;
    if (pmVar6 == pmVar1) {
      uVar5 = CONCAT71((int7)(uVar4 >> 8),1);
      goto LAB_0014963e;
    }
    detail::socket_base::send
              (&local_38,(int)pmVar6,(void *)(ulong)((uint)(pmVar6 + 1 != pmVar1) * 2 | flags),
               in_RCX,in_R8D);
    if ((extraout_RDX & 1) == 0) {
      _Var3 = _Var2;
      if (pmVar6 != (msgs->super__Vector_base<zmq::message_t,_std::allocator<zmq::message_t>_>).
                    _M_impl.super__Vector_impl_data._M_start) {
        __assert_fail("it == begin(msgs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                      ,0xf1,
                      "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::vector<zmq::message_t> &]"
                     );
      }
    }
    else {
      _Var3._M_value = _Var2._M_value + 1;
      pmVar6 = pmVar6 + 1;
    }
    uVar4 = extraout_RDX;
  } while ((extraout_RDX & 1) != 0);
  uVar5 = 0;
LAB_0014963e:
  sVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar5;
  sVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var2._M_value;
  return (send_result_t)
         sVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}